

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7284ee::
DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
::RundrPredTest(DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
                *this,int speed)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  uint p_angle;
  uint uVar6;
  
  if ((this->params_).tst_fn !=
      (_func_void_uchar_ptr_long_int_int_uchar_ptr_uchar_ptr_int_int_int_int_int *)0x0) {
    uVar4 = this->start_angle_;
    uVar1 = this->stop_angle_;
    if (speed != 0) {
      uVar4 = 0;
      uVar1 = 3;
    }
    this->enable_upsample_ = 0;
    do {
      piVar5 = &DAT_00c4edec + (int)uVar4;
      uVar6 = uVar4;
      if ((int)uVar4 < (int)uVar1) {
        do {
          p_angle = uVar6;
          if (speed != 0) {
            p_angle = this->start_angle_ + *piVar5;
          }
          uVar2 = p_angle;
          if (p_angle - 1 < 0x59) {
LAB_004d1b33:
            iVar3 = (int)dr_intra_derivative[uVar2];
          }
          else {
            iVar3 = 1;
            if (p_angle - 0x5b < 0x59) {
              uVar2 = 0xb4 - p_angle;
              goto LAB_004d1b33;
            }
          }
          this->dx_ = iVar3;
          if (p_angle - 0x5b < 0x59) {
            uVar2 = p_angle - 0x5a;
LAB_004d1b6f:
            iVar3 = (int)dr_intra_derivative[uVar2];
          }
          else {
            iVar3 = 1;
            if (p_angle - 0xb5 < 0x59) {
              uVar2 = 0x10e - p_angle;
              goto LAB_004d1b6f;
            }
          }
          this->dy_ = iVar3;
          if (speed != 0) {
            printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                   (ulong)(uint)this->enable_upsample_,(ulong)p_angle);
          }
          if ((this->dx_ != 0) && (this->dy_ != 0)) {
            RunTest(this,speed != 0,false,p_angle);
          }
          piVar5 = piVar5 + 1;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      iVar3 = this->enable_upsample_;
      this->enable_upsample_ = iVar3 + 1;
    } while (iVar3 < 1);
  }
  return;
}

Assistant:

void RundrPredTest(const int speed) {
    if (params_.tst_fn == nullptr) return;
    const int angles[] = { 3, 45, 87 };
    const int start_angle = speed ? 0 : start_angle_;
    const int stop_angle = speed ? 3 : stop_angle_;
    for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
      for (int i = start_angle; i < stop_angle; ++i) {
        const int angle = speed ? angles[i] + start_angle_ : i;
        dx_ = av1_get_dx(angle);
        dy_ = av1_get_dy(angle);
        if (speed) {
          printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                 enable_upsample_, angle);
        }
        if (dx_ && dy_) RunTest(speed, false, angle);
      }
    }
  }